

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O2

int kvtree_write_to_gather(char *prefix,kvtree *data,int ranks)

{
  int iVar1;
  int iVar2;
  char *__nptr;
  long lVar3;
  kvtree *hash1;
  kvtree *pkVar4;
  kvtree_elem_struct *elem;
  long lVar5;
  long lVar6;
  ulong uVar7;
  int local_868;
  kvtree *entries;
  int local_854;
  kvtree *local_850;
  char *local_848;
  kvtree *files_hash;
  char partname [1024];
  char filename [1024];
  
  local_848 = prefix;
  __nptr = getenv("KVTREE_ENTRIES_PER_FILE");
  if (__nptr == (char *)0x0) {
    lVar3 = 0x2000;
  }
  else {
    lVar3 = atol(__nptr);
  }
  kvtree_sort_int(data,0);
  local_850 = kvtree_new();
  files_hash = local_850;
  kvtree_set_kv_int(local_850,"LEVEL",1);
  if (data == (kvtree *)0x0) {
    elem = (kvtree_elem_struct *)0x0;
  }
  else {
    elem = data->lh_first;
  }
  if (lVar3 < 1) {
    lVar3 = 0;
  }
  uVar7 = 0;
  local_868 = 0;
  do {
    pkVar4 = local_850;
    if (elem == (kvtree_elem_struct *)0x0) {
      kvtree_set_kv_int(local_850,"RANKS",ranks);
      iVar2 = kvtree_write_file(local_848,pkVar4);
      iVar1 = 1;
      if (iVar2 == 0) {
        iVar1 = local_868;
      }
      kvtree_delete(&files_hash);
      return iVar1;
    }
    entries = kvtree_new();
    kvtree_set_kv_int(entries,"LEVEL",0);
    kvtree_set_kv_int(entries,"RANKS",ranks);
    lVar5 = 0;
    do {
      lVar6 = lVar3;
      if (lVar3 == lVar5) goto LAB_001052f6;
      iVar1 = kvtree_elem_key_int(elem);
      pkVar4 = elem->hash;
      hash1 = kvtree_set_kv_int(entries,"RANK",iVar1);
      kvtree_merge(hash1,pkVar4);
      lVar5 = lVar5 + 1;
      elem = (elem->pointers).le_next;
    } while (elem != (kvtree_elem_struct *)0x0);
    elem = (kvtree_elem_struct *)0x0;
    lVar6 = lVar5;
LAB_001052f6:
    snprintf(filename,0x400,"%s.0.%d",local_848,uVar7);
    local_854 = kvtree_write_file(filename,entries);
    kvtree_delete(&entries);
    snprintf(partname,0x400,".0.%d",uVar7);
    pkVar4 = kvtree_set_kv_int(local_850,"RANK",(int)uVar7);
    kvtree_util_set_str(pkVar4,"FILE",partname);
    kvtree_util_set_bytecount(pkVar4,"OFFSET",0);
    uVar7 = (ulong)(uint)((int)uVar7 + (int)lVar6);
    if (local_854 != 0) {
      elem = (kvtree_elem_struct *)0x0;
      local_868 = 1;
    }
  } while( true );
}

Assistant:

int kvtree_write_to_gather(const char* prefix, kvtree* data, int ranks)
{
  int rc = KVTREE_SUCCESS;
  /* record up to 8K entries per file */
  long entries_per_file = 8192;

  /*
   * KVTREE_ENTRIES_PER_FILE is only used for testing.  Specifically, you can
   * set it to something low like 1 to force kvwrite_write_to_gather() to write
   * multiple kvtree files.
   */
  if (getenv("KVTREE_ENTRIES_PER_FILE")) {
    entries_per_file = atol(getenv("KVTREE_ENTRIES_PER_FILE"));
  }

  /* we hardcode this to be two levels deep */

  /* sort so that elements are ordered by rank value */
  kvtree_sort_int(data, KVTREE_SORT_ASCENDING);

  /* create hash for primary map and encode level */
  kvtree* files_hash = kvtree_new();
  kvtree_set_kv_int(files_hash, "LEVEL", 1);

  /* iterate over each rank to record its info */
  int writer = 0;
  int max_rank = -1;
  kvtree_elem* elem = kvtree_elem_first(data);
  while (elem != NULL) {
    /* create a hash to record an entry from each rank */
    kvtree* entries = kvtree_new();
    kvtree_set_kv_int(entries, "LEVEL", 0);

    /* record the total number of ranks in each file */
    kvtree_set_kv_int(entries, "RANKS", ranks);

    int count = 0;
    while (count < entries_per_file) {
      /* get rank id */
      int rank = kvtree_elem_key_int(elem);
      if (rank > max_rank) {
        max_rank = rank;
      }

      /* copy hash of current rank under RANK/<rank> in entries */
      kvtree* elem_hash = kvtree_elem_hash(elem);
      kvtree* rank_hash = kvtree_set_kv_int(entries, "RANK", rank);
      kvtree_merge(rank_hash, elem_hash);
      count++;

      /* break early if we reach the end */
      elem = kvtree_elem_next(elem);
      if (elem == NULL) {
        break;
      }
    }

    /* build name for part file */
    char filename[1024];
    snprintf(filename, sizeof(filename), "%s.0.%d", prefix, writer);

    /* write hash to file */
    if (kvtree_write_file(filename, entries) != KVTREE_SUCCESS) {
      rc = KVTREE_FAILURE;
      elem = NULL;
    }

    /* delete part hash and path */
    kvtree_delete(&entries);

    /* record file name of part in files hash, relative to prefix directory */
    char partname[1024];
    snprintf(partname, sizeof(partname), ".0.%d", writer);
    unsigned long offset = 0;
    kvtree* files_rank_hash = kvtree_set_kv_int(files_hash, "RANK", writer);
    kvtree_util_set_str(files_rank_hash, "FILE", partname);
    kvtree_util_set_bytecount(files_rank_hash, "OFFSET", offset);

    /* get id of next writer */
    writer += count;
  }

  /* record total number of ranks in job as max rank + 1 */
  kvtree_set_kv_int(files_hash, "RANKS", ranks);

  /* write out root file */
  if (kvtree_write_file(prefix, files_hash) != KVTREE_SUCCESS) {
    rc = KVTREE_FAILURE;
  }
  kvtree_delete(&files_hash);

  return rc;
}